

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void * __thiscall
chrono::ChClassRegistration<chrono::geometry::ChTriangleMeshConnected>::create
          (ChClassRegistration<chrono::geometry::ChTriangleMeshConnected> *this)

{
  type pvVar1;
  
  pvVar1 = _create<chrono::geometry::ChTriangleMeshConnected>(this);
  return pvVar1;
}

Assistant:

virtual void* create() {
        return _create();
    }